

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptSimpleStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  bool bVar2;
  TIntermTyped *node;
  TIntermTyped *local_20;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
  bVar2 = true;
  if ((!bVar1) && (bVar1 = acceptDeclaration(this,statement), !bVar1)) {
    bVar1 = acceptExpression(this,&local_20);
    if (bVar1) {
      *statement = &local_20->super_TIntermNode;
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      if (bVar1) {
        return true;
      }
      expected(this,";");
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HlslGrammar::acceptSimpleStatement(TIntermNode*& statement)
{
    // SEMICOLON
    if (acceptTokenClass(EHTokSemicolon))
        return true;

    // declaration
    if (acceptDeclaration(statement))
        return true;

    // expression
    TIntermTyped* node;
    if (acceptExpression(node))
        statement = node;
    else
        return false;

    // SEMICOLON (following an expression)
    if (acceptTokenClass(EHTokSemicolon))
        return true;
    else {
        expected(";");
        return false;
    }
}